

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O1

void PredictorAdd1_SSE2(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  uint32_t *puVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  
  uVar4 = 0;
  if (3 < num_pixels) {
    cVar27 = (char)out[2];
    cVar28 = *(char *)((long)out + 9);
    cVar29 = *(char *)((long)out + 10);
    cVar30 = *(char *)((long)out + 0xb);
    uVar3 = 0;
    do {
      auVar2 = *(undefined1 (*) [16])(in + uVar3);
      cVar7 = auVar2[0];
      cVar8 = auVar2[1];
      cVar9 = auVar2[2];
      cVar10 = auVar2[3];
      cVar15 = cVar7 + auVar2[4];
      cVar17 = cVar8 + auVar2[5];
      cVar19 = cVar9 + auVar2[6];
      cVar21 = cVar10 + auVar2[7];
      cVar11 = cVar7 + cVar27;
      cVar12 = cVar8 + cVar28;
      cVar13 = cVar9 + cVar29;
      cVar14 = cVar10 + cVar30;
      cVar16 = cVar15 + cVar27;
      cVar18 = cVar17 + cVar28;
      cVar20 = cVar19 + cVar29;
      cVar22 = cVar21 + cVar30;
      cVar23 = auVar2[4] + auVar2[8] + cVar27;
      cVar24 = auVar2[5] + auVar2[9] + cVar28;
      cVar25 = auVar2[6] + auVar2[10] + cVar29;
      cVar26 = auVar2[7] + auVar2[0xb] + cVar30;
      cVar27 = auVar2[8] + auVar2[0xc] + cVar27 + cVar15;
      cVar28 = auVar2[9] + auVar2[0xd] + cVar28 + cVar17;
      cVar29 = auVar2[10] + auVar2[0xe] + cVar29 + cVar19;
      cVar30 = auVar2[0xb] + auVar2[0xf] + cVar30 + cVar21;
      puVar1 = out + uVar3;
      *(char *)puVar1 = cVar11;
      *(char *)((long)puVar1 + 1) = cVar12;
      *(char *)((long)puVar1 + 2) = cVar13;
      *(char *)((long)puVar1 + 3) = cVar14;
      *(char *)(puVar1 + 1) = cVar16;
      *(char *)((long)puVar1 + 5) = cVar18;
      *(char *)((long)puVar1 + 6) = cVar20;
      *(char *)((long)puVar1 + 7) = cVar22;
      *(char *)(puVar1 + 2) = cVar23 + cVar7;
      *(char *)((long)puVar1 + 9) = cVar24 + cVar8;
      *(char *)((long)puVar1 + 10) = cVar25 + cVar9;
      *(char *)((long)puVar1 + 0xb) = cVar26 + cVar10;
      *(char *)(puVar1 + 3) = cVar27;
      *(char *)((long)puVar1 + 0xd) = cVar28;
      *(char *)((long)puVar1 + 0xe) = cVar29;
      *(char *)((long)puVar1 + 0xf) = cVar30;
      uVar4 = uVar3 + 4;
      uVar6 = uVar3 + 8;
      uVar3 = uVar4;
    } while (uVar6 <= (uint)num_pixels);
  }
  iVar5 = num_pixels - (int)uVar4;
  if (iVar5 == 0) {
    return;
  }
  uVar4 = uVar4 & 0xffffffff;
  (*VP8LPredictorsAdd_C[1])(in + uVar4,upper + uVar4,iVar5,out + uVar4);
  return;
}

Assistant:

static void PredictorAdd1_SSE2(const uint32_t* in, const uint32_t* upper,
                               int num_pixels, uint32_t* WEBP_RESTRICT out) {
  int i;
  __m128i prev = _mm_set1_epi32((int)out[-1]);
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    // a | b | c | d
    const __m128i src = _mm_loadu_si128((const __m128i*)&in[i]);
    // 0 | a | b | c
    const __m128i shift0 = _mm_slli_si128(src, 4);
    // a | a + b | b + c | c + d
    const __m128i sum0 = _mm_add_epi8(src, shift0);
    // 0 | 0 | a | a + b
    const __m128i shift1 = _mm_slli_si128(sum0, 8);
    // a | a + b | a + b + c | a + b + c + d
    const __m128i sum1 = _mm_add_epi8(sum0, shift1);
    const __m128i res = _mm_add_epi8(sum1, prev);
    _mm_storeu_si128((__m128i*)&out[i], res);
    // replicate prev output on the four lanes
    prev = _mm_shuffle_epi32(res, (3 << 0) | (3 << 2) | (3 << 4) | (3 << 6));
  }
  if (i != num_pixels) {
    VP8LPredictorsAdd_C[1](in + i, upper + i, num_pixels - i, out + i);
  }
}